

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpg_tools.cc
# Opt level: O0

vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *
projects::dpg::BoundaryQuadRule
          (vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *__return_storage_ptr__,
          RefEl ref_el,QuadRule *qr)

{
  allocator<lf::quad::QuadRule> *this;
  RefElType RVar1;
  size_type sVar2;
  ostream *poVar3;
  element_type *peVar4;
  pointer pGVar5;
  MatrixXd *pMVar6;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_00;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  reference this_01;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar7;
  Matrix<double,__1,_1,_0,__1,_1> local_3f0;
  Matrix<double,__1,__1,_0,__1,__1> local_3e0;
  RefEl local_3c1;
  undefined1 local_3c0 [8];
  QuadRule bqr;
  int local_384;
  Matrix<double,__1,_1,_0,__1,_1> local_380;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_370;
  Matrix<double,__1,__1,_0,__1,__1> local_350;
  Matrix<double,__1,_1,_0,__1,_1> local_338;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_328;
  undefined1 local_318 [8];
  VectorXd Weights;
  MatrixXd Points;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> edge_ptr;
  int segment;
  allocator<char> local_2d9;
  size_type numSegments;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  stringstream local_1f8 [8];
  stringstream ss;
  ostream local_1e8 [383];
  RefEl local_69;
  undefined1 local_68 [23];
  RefEl local_51;
  Matrix<double,__1,__1,_0,__1,__1> local_50;
  undefined1 local_30 [8];
  shared_ptr<lf::geometry::Geometry> geo_ptr;
  QuadRule *qr_local;
  vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *pvStack_10;
  RefEl ref_el_local;
  vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_> *BoundaryQuadRules;
  
  geo_ptr.super___shared_ptr<lf::geometry::Geometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)qr;
  qr_local._7_1_ = ref_el.type_;
  pvStack_10 = __return_storage_ptr__;
  std::shared_ptr<lf::geometry::Geometry>::shared_ptr
            ((shared_ptr<lf::geometry::Geometry> *)local_30);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&qr_local + 7));
  if (RVar1 == kTria) {
    local_51 = lf::base::RefEl::kTria();
    lf::base::RefEl::NodeCoords(&local_51);
    std::make_shared<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>(&local_50);
    std::shared_ptr<lf::geometry::Geometry>::operator=
              ((shared_ptr<lf::geometry::Geometry> *)local_30,
               (shared_ptr<lf::geometry::TriaO1> *)&local_50);
    std::shared_ptr<lf::geometry::TriaO1>::~shared_ptr
              ((shared_ptr<lf::geometry::TriaO1> *)&local_50);
  }
  else {
    if (RVar1 != kQuad) {
      std::__cxx11::stringstream::stringstream(local_1f8);
      poVar3 = lf::base::operator<<(local_1e8,(RefEl *)((long)&qr_local + 7));
      std::operator<<(poVar3,"unsupported reference element.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"false",&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/dpg_tools.cc"
                 ,&local_241);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_218,&local_240,0x1b,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"false",&local_289);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/dpg_tools.cc"
                 ,&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&numSegments,"",&local_2d9);
      lf::base::AssertionFailed(&local_288,&local_2b0,0x1b,(string *)&numSegments);
      std::__cxx11::string::~string((string *)&numSegments);
      std::allocator<char>::~allocator(&local_2d9);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      abort();
    }
    local_69 = lf::base::RefEl::kQuad();
    lf::base::RefEl::NodeCoords(&local_69);
    std::make_shared<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_68);
    std::shared_ptr<lf::geometry::Geometry>::operator=
              ((shared_ptr<lf::geometry::Geometry> *)local_30,
               (shared_ptr<lf::geometry::QuadO1> *)local_68);
    std::shared_ptr<lf::geometry::QuadO1>::~shared_ptr((shared_ptr<lf::geometry::QuadO1> *)local_68)
    ;
  }
  sVar2 = lf::base::RefEl::NumSubEntities((RefEl *)((long)&qr_local + 7),1);
  edge_ptr._M_t.
  super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>._M_t.
  super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>.
  super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl._7_1_ = 0;
  this = (allocator<lf::quad::QuadRule> *)
         ((long)&edge_ptr._M_t.
                 super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                 .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 6);
  std::allocator<lf::quad::QuadRule>::allocator(this);
  std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::vector
            (__return_storage_ptr__,(ulong)sVar2,this);
  std::allocator<lf::quad::QuadRule>::~allocator
            ((allocator<lf::quad::QuadRule> *)
             ((long)&edge_ptr._M_t.
                     super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                     .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 6));
  for (edge_ptr._M_t.
       super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
       .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl._0_4_ = 0;
      (uint)edge_ptr._M_t.
            super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
            ._M_t.
            super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
            .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl < sVar2;
      edge_ptr._M_t.
      super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>.
      _M_t.
      super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
      .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl._0_4_ =
           (uint)edge_ptr._M_t.
                 super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                 .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 1) {
    peVar4 = std::
             __shared_ptr_access<lf::geometry::Geometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::geometry::Geometry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    (*peVar4->_vptr_Geometry[7])
              (&Points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,peVar4,1,
               (ulong)(uint)edge_ptr._M_t.
                            super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                            .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl);
    pGVar5 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
             operator->((unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                         *)&Points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols);
    pMVar6 = lf::quad::QuadRule::Points
                       ((QuadRule *)
                        geo_ptr.
                        super___shared_ptr<lf::geometry::Geometry,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    (*pGVar5->_vptr_Geometry[3])
              (&Weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,pGVar5,pMVar6);
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              lf::quad::QuadRule::Weights
                        ((QuadRule *)
                         geo_ptr.
                         super___shared_ptr<lf::geometry::Geometry,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    pGVar5 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
             operator->((unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                         *)&Points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols);
    local_384 = 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_380,&local_384);
    bqr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_370,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_380,
               (Scalar *)
               &bqr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    other = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_370);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_350,other);
    (*pGVar5->_vptr_Geometry[6])(&local_338,pGVar5,&local_350);
    PVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                      (this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_338);
    local_328 = PVar7;
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)local_318,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_328);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_338);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_350);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_370);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_380);
    local_3c1.type_ = qr_local._7_1_;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              (&local_3e0,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &Weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              (&local_3f0,(Matrix<double,__1,_1,_0,__1,_1> *)local_318);
    lf::quad::QuadRule::QuadRule((QuadRule *)local_3c0,local_3c1,&local_3e0,&local_3f0,0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_3f0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_3e0);
    this_01 = std::vector<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>::operator[]
                        (__return_storage_ptr__,
                         (long)(int)(uint)edge_ptr._M_t.
                                          super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                                          .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>.
                                          _M_head_impl);
    lf::quad::QuadRule::operator=(this_01,(QuadRule *)local_3c0);
    lf::quad::QuadRule::~QuadRule((QuadRule *)local_3c0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_318);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &Weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
    ~unique_ptr((unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
                &Points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  }
  edge_ptr._M_t.
  super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>._M_t.
  super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>.
  super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl._7_1_ = 1;
  std::shared_ptr<lf::geometry::Geometry>::~shared_ptr
            ((shared_ptr<lf::geometry::Geometry> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<lf::quad::QuadRule> BoundaryQuadRule(lf::base::RefEl ref_el,
                                                 const lf::quad::QuadRule& qr) {
  // construct the geometry of the reference element
  std::shared_ptr<lf::geometry::Geometry> geo_ptr;
  switch (ref_el) {
    case (lf::base::RefEl::kTria()):
      geo_ptr = std::make_shared<lf::geometry::TriaO1>(
          lf::base::RefEl::kTria().NodeCoords());
      break;
    case (lf::base::RefEl::kQuad()):
      geo_ptr = std::make_shared<lf::geometry::QuadO1>(
          lf::base::RefEl::kQuad().NodeCoords());
      break;
    default:
      LF_ASSERT_MSG(false, ref_el << "unsupported reference element.");
  }

  // query the number of edges
  const lf::base::size_type numSegments = ref_el.NumSubEntities(1);
  std::vector<lf::quad::QuadRule> BoundaryQuadRules(numSegments);

  // iterate over edges
  for (int segment = 0; segment < numSegments; ++segment) {
    // query edge geometry and transform weights
    auto edge_ptr = geo_ptr->SubGeometry(1, segment);
    const Eigen::MatrixXd Points = edge_ptr->Global(qr.Points());
    const Eigen::VectorXd Weights =
        qr.Weights() *
        edge_ptr->IntegrationElement((Eigen::VectorXd(1) << 0.5).finished());
    const lf::quad::QuadRule bqr(ref_el, Points, Weights, 0);
    BoundaryQuadRules[segment] = bqr;
  }

  return BoundaryQuadRules;
}